

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O2

void dumpAttribute(raw_ostream *OS,DWARFDie *Die,uint64_t *OffsetPtr,Attribute Attr,Form Form,
                  uint Indent,DIDumpOptions DumpOpts)

{
  byte bVar1;
  uint64_t FileIndex;
  DWARFContext *pDVar2;
  DWARFObject *pDVar3;
  pointer pDVar4;
  size_type sVar5;
  DWARFSection *pDVar6;
  long lVar7;
  pointer pcVar8;
  undefined8 uVar9;
  DIDumpOptions DumpOpts_00;
  DIDumpOptions DumpOpts_01;
  DIDumpOptions DumpOpts_02;
  DIDumpOptions DumpOpts_03;
  DIDumpOptions DumpOpts_04;
  ArrayRef<unsigned_char> AVar10;
  uint3 uVar11;
  DWARFContext *pDVar12;
  bool bVar13;
  Attribute AVar14;
  uint16_t Version;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  LineTable *this;
  unsigned_long *puVar19;
  char *pcVar20;
  ArrayRef<unsigned_char> *pAVar21;
  raw_ostream *prVar22;
  storage_type *psVar23;
  SectionedAddress *pSVar24;
  undefined4 extraout_var;
  Error *E;
  raw_ostream *prVar25;
  undefined4 in_register_0000008c;
  DWARFAddressRange *R;
  DWARFUnit *U;
  ulong uVar26;
  pointer this_00;
  HighlightColor Color;
  unsigned_long uVar27;
  Optional<unsigned_long> OVar28;
  StringRef Str;
  char acStack_408 [8];
  char BaseIndent [13];
  Optional<unsigned_long> Val;
  DWARFObject *local_3e0;
  char *pcStack_240;
  uint64_t Index;
  uint8_t local_230;
  uint8_t local_22f;
  DWARFObject *local_228;
  DWARFSection *local_220;
  ErrorAdapter local_218;
  undefined1 auStack_208 [8];
  string File;
  undefined1 auStack_1d8 [8];
  string Space;
  byte local_170;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 aStack_148;
  uint64_t HighPC;
  uint local_138;
  undefined1 uStack_134;
  undefined1 uStack_133;
  undefined1 uStack_132;
  undefined1 uStack_131;
  unsigned_long local_f0;
  uint64_t Offset;
  _Alloc_hider _Stack_e0;
  undefined1 local_d8 [8];
  DWARFFormValue FormValue;
  uint local_98;
  undefined2 uStack_93;
  undefined1 uStack_91;
  anon_union_24_2_427f0595_for_Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>_2
  local_88;
  undefined1 local_70 [20];
  uint local_5c;
  undefined **local_58;
  Form local_4a;
  DWARFUnit *pDStack_48;
  Form Form_local;
  raw_ostream *local_40;
  undefined2 local_38;
  undefined1 local_36;
  char local_33;
  Attribute local_32 [4];
  Attribute Attr_local;
  
  local_58 = (undefined **)CONCAT44(in_register_0000008c,Indent);
  if (Die->U == (DWARFUnit *)0x0) {
    return;
  }
  if (Die->Die == (DWARFDebugInfoEntry *)0x0) {
    return;
  }
  builtin_strncpy(BaseIndent,"    ",5);
  builtin_strncpy(acStack_408,"        ",8);
  local_4a = Form;
  local_32[0] = Attr;
  llvm::raw_ostream::operator<<(OS,acStack_408);
  llvm::raw_ostream::indent(OS,(int)local_58 + 2);
  llvm::WithColor::WithColor((WithColor *)auStack_1d8,OS,Attribute,false);
  llvm::formatv<llvm::dwarf::Attribute_&>
            ((formatv_object<std::tuple<llvm::detail::provider_format_adapter<llvm::dwarf::Attribute_&>_>_>
              *)(BaseIndent + 8),"{0}",local_32);
  llvm::raw_ostream::operator<<((raw_ostream *)auStack_1d8,(formatv_object_base *)(BaseIndent + 8));
  llvm::formatv_object_base::~formatv_object_base((formatv_object_base *)(BaseIndent + 8));
  llvm::WithColor::~WithColor((WithColor *)auStack_1d8);
  local_33 = DumpOpts.Verbose;
  if ((DumpOpts.Verbose != false) || (DumpOpts.ShowForm == true)) {
    llvm::formatv<llvm::dwarf::Form_&>
              ((formatv_object<std::tuple<llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>_>_>
                *)(BaseIndent + 8)," [{0}]",&local_4a);
    llvm::raw_ostream::operator<<(OS,(formatv_object_base *)(BaseIndent + 8));
    llvm::formatv_object_base::~formatv_object_base((formatv_object_base *)(BaseIndent + 8));
  }
  U = Die->U;
  llvm::DWARFFormValue::createFromUnit((DWARFFormValue *)local_d8,local_4a,U,OffsetPtr);
  llvm::raw_ostream::operator<<(OS,"\t(");
  auStack_208 = (undefined1  [8])&File._M_string_length;
  File._M_dataplus._M_p = (pointer)0x0;
  _Offset = (StringRef)ZEXT816(0);
  File._M_string_length._0_1_ = 0;
  pDStack_48 = U;
  if ((local_32[0] == DW_AT_call_file) || (local_32[0] == DW_AT_decl_file)) {
    this = llvm::DWARFContext::getLineTableForUnit(U->Context,U);
    Color = String;
    if (this != (LineTable *)0x0) {
      OVar28 = llvm::DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)local_d8);
      stack0xfffffffffffffc08 = OVar28.Storage._0_9_;
      puVar19 = llvm::optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                          ((OptionalStorage<unsigned_long,_true> *)(BaseIndent + 8));
      FileIndex = *puVar19;
      pcVar20 = llvm::DWARFUnit::getCompilationDir(pDStack_48);
      llvm::StringRef::StringRef((StringRef *)((long)&File.field_2 + 8),pcVar20);
      bVar13 = llvm::DWARFDebugLine::LineTable::getFileNameByIndex
                         (this,FileIndex,stack0xfffffffffffffe18,AbsoluteFilePath,
                          (string *)auStack_208);
      U = pDStack_48;
      if (bVar13) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_1d8,'\"',
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_208);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (BaseIndent + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_1d8,'\"');
        std::__cxx11::string::operator=((string *)auStack_208,(string *)(BaseIndent + 8));
        std::__cxx11::string::~string((string *)(BaseIndent + 8));
        std::__cxx11::string::~string((string *)auStack_1d8);
        _Stack_e0 = (_Alloc_hider)File._M_dataplus._M_p;
        Offset = (uint64_t)auStack_208;
        U = pDStack_48;
      }
    }
  }
  else {
    OVar28 = llvm::DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)local_d8);
    AVar14 = local_32[0];
    stack0xfffffffffffffc08 = OVar28.Storage._0_9_;
    if (((undefined1  [16])OVar28.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      puVar19 = llvm::optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                          ((OptionalStorage<unsigned_long,_true> *)(BaseIndent + 8));
      _Offset = llvm::dwarf::AttributeValueString(AVar14,(uint)*puVar19);
    }
    Color = Enumerator;
  }
  local_40 = OS;
  if (_Stack_e0._M_p == (pointer)0x0) {
    if (local_32[0] == DW_AT_high_pc) {
      AVar14 = DW_AT_high_pc;
      if ((DumpOpts.ShowForm != false || local_33 != '\0') ||
         (OVar28 = llvm::DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)local_d8),
         AVar14 = local_32[0],
         ((undefined1  [16])OVar28.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0))
      goto LAB_00d963e9;
      if (DumpOpts.ShowAddresses == true) {
        bVar13 = llvm::DWARFDie::getLowAndHighPC
                           (Die,(uint64_t *)auStack_1d8,&aStack_148.value,
                            (uint64_t *)&stack0xfffffffffffffdc0);
        if (bVar13) {
          Val.Storage.field_0 =
               (anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2)"0x%016lx";
          stack0xfffffffffffffc08 = (uchar *)&PTR_home_01127cf0;
          Val.Storage._8_8_ = aStack_148;
          llvm::raw_ostream::operator<<(local_40,(format_object_base *)(BaseIndent + 8));
        }
        else {
          llvm::DWARFFormValue::dump((DWARFFormValue *)local_d8,local_40,DumpOpts);
        }
      }
    }
    else if ((local_32[0] == DW_AT_call_line) ||
            (AVar14 = local_32[0], local_32[0] == DW_AT_decl_line)) {
      OVar28 = llvm::DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)local_d8);
      stack0xfffffffffffffc08 = OVar28.Storage._0_9_;
      puVar19 = llvm::optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                          ((OptionalStorage<unsigned_long,_true> *)(BaseIndent + 8));
      llvm::raw_ostream::operator<<(OS,*puVar19);
    }
    else {
LAB_00d963e9:
      bVar13 = llvm::DWARFAttribute::mayHaveLocationDescription(AVar14);
      if (bVar13) {
        uVar9 = DumpOpts._16_8_;
        pcVar8 = DumpOpts._8_8_;
        FormValue.C = (DWARFContext *)DumpOpts._0_8_;
        pDVar2 = U->Context;
        local_70._8_8_ =
             (pDVar2->RegInfo)._M_t.
             super___uniq_ptr_impl<llvm::MCRegisterInfo,_std::default_delete<llvm::MCRegisterInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_llvm::MCRegisterInfo_*,_std::default_delete<llvm::MCRegisterInfo>_>
             .super__Head_base<0UL,_llvm::MCRegisterInfo_*,_false>._M_head_impl;
        pDVar3 = (pDVar2->DObj)._M_t.
                 super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                 .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
        bVar13 = llvm::DWARFFormValue::isFormClass((DWARFFormValue *)local_d8,FC_Block);
        if ((bVar13) ||
           (bVar13 = llvm::DWARFFormValue::isFormClass((DWARFFormValue *)local_d8,FC_Exprloc),
           bVar13)) {
          llvm::DWARFFormValue::getAsBlock
                    ((Optional<llvm::ArrayRef<unsigned_char>_> *)(BaseIndent + 8),
                     (DWARFFormValue *)local_d8);
          pAVar21 = llvm::optional_detail::OptionalStorage<llvm::ArrayRef<unsigned_char>,_true>::
                    getValue((OptionalStorage<llvm::ArrayRef<unsigned_char>,_true> *)
                             (BaseIndent + 8));
          AVar10 = *pAVar21;
          iVar15 = (*((pDVar2->DObj)._M_t.
                      super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                      .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)->
                     _vptr_DWARFObject[5])();
          uVar11._0_2_ = (pDStack_48->Header).FormParams.Version;
          uVar11._2_1_ = (pDStack_48->Header).FormParams.AddrSize;
          Val.Storage._9_1_ = 0;
          Val.Storage.hasVal = (bool)(byte)iVar15;
          local_3e0 = (DWARFObject *)(ulong)uVar11;
          uVar18 = (uint)(pDStack_48->Header).FormParams.AddrSize;
          unique0x10001f24 = AVar10;
          if ((8 < uVar18) || ((0x114U >> (uVar18 & 0x1f) & 1) == 0)) {
            __assert_fail("AddressSize == 8 || AddressSize == 4 || AddressSize == 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/DebugInfo/DWARF/DWARFExpression.h"
                          ,0x84,
                          "llvm::DWARFExpression::DWARFExpression(DataExtractor, uint16_t, uint8_t)"
                         );
          }
          llvm::DWARFExpression::print
                    ((DWARFExpression *)(BaseIndent + 8),local_40,(MCRegisterInfo *)local_70._8_8_,
                     pDStack_48,false);
        }
        else {
          bVar13 = llvm::DWARFFormValue::isFormClass((DWARFFormValue *)local_d8,FC_SectionOffset);
          if (bVar13) {
            OVar28 = llvm::DWARFFormValue::getAsSectionOffset((DWARFFormValue *)local_d8);
            stack0xfffffffffffffc08 = OVar28.Storage._0_9_;
            puVar19 = llvm::optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                                ((OptionalStorage<unsigned_long,_true> *)(BaseIndent + 8));
            local_f0 = *puVar19;
            llvm::DWARFUnit::getBaseAddress
                      ((Optional<llvm::object::SectionedAddress> *)(BaseIndent + 8),pDStack_48);
            if (Val.Storage.hasVal == true) {
              pSVar24 = llvm::optional_detail::OptionalStorage<llvm::object::SectionedAddress,_true>
                        ::getValue((OptionalStorage<llvm::object::SectionedAddress,_true> *)
                                   (BaseIndent + 8));
              local_88._8_8_ = pSVar24->Address;
            }
            else {
              local_88._8_8_ = 0;
            }
            pDVar12 = FormValue.C;
            local_5c = (int)local_58 + 0x11;
            local_98 = DumpOpts._16_4_;
            uStack_91 = DumpOpts._23_1_;
            local_36 = uStack_91;
            uStack_93 = DumpOpts._21_2_;
            local_38 = uStack_93;
            if (pDStack_48->IsDWO == false) {
              pDVar6 = (pDStack_48->field_7).LocSection;
              if ((pDVar6->Data).Length == 0) {
                iVar15 = (*pDVar3->_vptr_DWARFObject[0xb])(pDVar3);
                iVar16 = (*((pDVar2->DObj)._M_t.
                            super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                            .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)->
                           _vptr_DWARFObject[5])();
                iVar17 = (*pDVar3->_vptr_DWARFObject[6])(pDVar3);
                unique0x10001243 = *(ArrayRef<unsigned_char> *)CONCAT44(extraout_var,iVar15);
                Val.Storage._9_1_ = (char)iVar17;
                Val.Storage.hasVal = SUB41(iVar16,0);
                local_3e0 = pDVar3;
                if (((ArrayRef<unsigned_char> *)CONCAT44(extraout_var,iVar15))->Length != 0) {
                  Version = (pDStack_48->Header).FormParams.Version;
                  goto LAB_00d96cbe;
                }
              }
              else {
                Val.Storage.field_0 =
                     (anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2)0x400000000
                ;
                stack0xfffffffffffffc08 = &Val.Storage.hasVal;
                iVar15 = (*((pDVar2->DObj)._M_t.
                            super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                            .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)->
                           _vptr_DWARFObject[5])();
                iVar16 = (*pDVar3->_vptr_DWARFObject[6])(pDVar3);
                pcStack_240 = (pDVar6->Data).Data;
                Index = (pDVar6->Data).Length;
                local_230 = (uint8_t)iVar15;
                local_22f = (uint8_t)iVar16;
                DumpOpts_02._8_8_ = pcVar8;
                DumpOpts_02._0_8_ = FormValue.C;
                DumpOpts_02.ShowChildren = (bool)(char)uVar9;
                DumpOpts_02.ShowParents = (bool)(char)((ulong)uVar9 >> 8);
                DumpOpts_02.ShowForm = (bool)(char)((ulong)uVar9 >> 0x10);
                DumpOpts_02.SummarizeTypes = (bool)(char)((ulong)uVar9 >> 0x18);
                DumpOpts_02.Verbose = (bool)(char)((ulong)uVar9 >> 0x20);
                DumpOpts_02.DisplayRawContents = (bool)(char)((ulong)uVar9 >> 0x28);
                DumpOpts_02._22_2_ = (short)((ulong)uVar9 >> 0x30);
                local_228 = pDVar3;
                local_220 = pDVar6;
                llvm::DWARFFormValue::dump((DWARFFormValue *)local_d8,local_40,DumpOpts_02);
                llvm::raw_ostream::operator<<(local_40,": ");
                llvm::DWARFDebugLoc::parseOneLocationList
                          ((Expected<llvm::DWARFDebugLoc::LocationList> *)auStack_1d8,
                           (DWARFDebugLoc *)(BaseIndent + 8),
                           (DWARFDataExtractor *)&stack0xfffffffffffffdc0,&local_f0);
                prVar25 = local_40;
                if ((local_170 & 1) == 0) {
                  local_88._16_8_ =
                       llvm::Expected<llvm::DWARFDebugLoc::LocationList>::getStorage
                                 ((Expected<llvm::DWARFDebugLoc::LocationList> *)auStack_1d8);
                  iVar15 = (*((pDVar2->DObj)._M_t.
                              super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                              .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)
                             ->_vptr_DWARFObject[5])();
                  uVar18 = (*pDVar3->_vptr_DWARFObject[6])(pDVar3);
                  local_138 = local_98;
                  aStack_148 = (anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2)
                               pDVar12;
                  uStack_134 = 0;
                  uStack_133 = (undefined1)local_38;
                  uStack_132 = (undefined1)((ushort)local_38 >> 8);
                  uStack_131 = local_36;
                  DumpOpts_04.Verbose = false;
                  DumpOpts_04.ShowChildren = (bool)(undefined1)local_98;
                  DumpOpts_04.ShowParents = (bool)local_98._1_1_;
                  DumpOpts_04.ShowForm = (bool)local_98._2_1_;
                  DumpOpts_04.SummarizeTypes = (bool)local_98._3_1_;
                  DumpOpts_04.DisplayRawContents = (bool)uStack_133;
                  DumpOpts_04._22_1_ = uStack_132;
                  DumpOpts_04._23_1_ = local_36;
                  DumpOpts_04._8_8_ = pcVar8;
                  DumpOpts_04._0_8_ = pDVar12;
                  HighPC = (uint64_t)pcVar8;
                  llvm::DWARFDebugLoc::LocationList::dump
                            ((LocationList *)local_88._16_8_,prVar25,local_88._8_8_,SUB41(iVar15,0),
                             uVar18 & 0xff,(MCRegisterInfo *)local_70._8_8_,pDStack_48,DumpOpts_04,
                             local_5c);
                }
                else {
                  llvm::raw_ostream::operator<<(local_40,'\n');
                  llvm::raw_ostream::indent(prVar25,local_5c);
                  llvm::Expected<llvm::DWARFDebugLoc::LocationList>::takeError
                            ((Expected<llvm::DWARFDebugLoc::LocationList> *)
                             &((anon_union_24_2_427f0595_for_Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>_2
                                *)local_70)->TStorage);
                  local_218.super_FormatAdapter<llvm::Error>.Item.Payload =
                       (ErrorInfoBase *)(local_70._0_8_ | 1);
                  local_70._0_8_ = 0;
                  local_218.super_FormatAdapter<llvm::Error>.super_format_adapter.
                  _vptr_format_adapter = (_func_int **)&PTR_anchor_01128458;
                  llvm::formatv<llvm::detail::ErrorAdapter>
                            ((formatv_object<std::tuple<llvm::detail::ErrorAdapter>_> *)&aStack_148,
                             "error extracting location list: {0}",&local_218);
                  llvm::raw_ostream::operator<<(prVar25,(formatv_object_base *)&aStack_148);
                  llvm::formatv_object<std::tuple<llvm::detail::ErrorAdapter>_>::~formatv_object
                            ((formatv_object<std::tuple<llvm::detail::ErrorAdapter>_> *)&aStack_148)
                  ;
                  llvm::detail::ErrorAdapter::~ErrorAdapter(&local_218);
                  if ((long *)(local_70._0_8_ & 0xfffffffffffffffe) != (long *)0x0) {
                    (**(code **)(*(long *)(local_70._0_8_ & 0xfffffffffffffffe) + 8))();
                  }
                }
                llvm::Expected<llvm::DWARFDebugLoc::LocationList>::~Expected
                          ((Expected<llvm::DWARFDebugLoc::LocationList> *)auStack_1d8);
                llvm::SmallVector<llvm::DWARFDebugLoc::LocationList,_4U>::~SmallVector
                          ((SmallVector<llvm::DWARFDebugLoc::LocationList,_4U> *)(BaseIndent + 8));
              }
            }
            else {
              local_88._16_8_ = (pDStack_48->field_7).LocSection;
              sVar5 = *(size_type *)((long)&(pDStack_48->field_7).LocSectionData + 8);
              iVar15 = (*((pDVar2->DObj)._M_t.
                          super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                          .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)->
                         _vptr_DWARFObject[5])();
              iVar16 = (*pDVar3->_vptr_DWARFObject[6])(pDVar3);
              Val.Storage.field_0 =
                   (anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2)sVar5;
              stack0xfffffffffffffc08 = (uchar *)local_88._16_8_;
              Val.Storage._9_1_ = (char)iVar16;
              Val.Storage.hasVal = SUB41(iVar15,0);
              local_3e0 = (DWARFObject *)0x0;
              Version = 4;
              if (sVar5 != 0) {
LAB_00d96cbe:
                Space._M_string_length._0_4_ = local_98;
                auStack_1d8 = (undefined1  [8])pDVar12;
                Space._M_string_length._4_1_ = 0;
                Space._M_string_length._5_2_ = local_38;
                Space._M_string_length._7_1_ = local_36;
                DumpOpts_03.Verbose = false;
                DumpOpts_03.ShowChildren = (bool)(undefined1)local_98;
                DumpOpts_03.ShowParents = (bool)local_98._1_1_;
                DumpOpts_03.ShowForm = (bool)local_98._2_1_;
                DumpOpts_03.SummarizeTypes = (bool)local_98._3_1_;
                DumpOpts_03._21_2_ = local_38;
                DumpOpts_03._23_1_ = local_36;
                DumpOpts_03._8_8_ = pcVar8;
                DumpOpts_03._0_8_ = pDVar12;
                Space._M_dataplus._M_p = pcVar8;
                llvm::DWARFDebugLoclists::dumpLocationList
                          ((DWARFDataExtractor *)(BaseIndent + 8),&local_f0,Version,local_40,
                           local_88._8_8_,(MCRegisterInfo *)local_70._8_8_,pDStack_48,DumpOpts_03,
                           local_5c);
              }
            }
          }
          else {
            DumpOpts_01._8_8_ = pcVar8;
            DumpOpts_01._0_8_ = FormValue.C;
            DumpOpts_01.ShowChildren = (bool)(char)uVar9;
            DumpOpts_01.ShowParents = (bool)(char)((ulong)uVar9 >> 8);
            DumpOpts_01.ShowForm = (bool)(char)((ulong)uVar9 >> 0x10);
            DumpOpts_01.SummarizeTypes = (bool)(char)((ulong)uVar9 >> 0x18);
            DumpOpts_01.Verbose = (bool)(char)((ulong)uVar9 >> 0x20);
            DumpOpts_01.DisplayRawContents = (bool)(char)((ulong)uVar9 >> 0x28);
            DumpOpts_01._22_2_ = (short)((ulong)uVar9 >> 0x30);
            llvm::DWARFFormValue::dump((DWARFFormValue *)local_d8,local_40,DumpOpts_01);
          }
        }
      }
      else {
        llvm::DWARFFormValue::dump((DWARFFormValue *)local_d8,OS,DumpOpts);
      }
    }
  }
  else {
    llvm::WithColor::WithColor((WithColor *)(BaseIndent + 8),OS,Color,false);
    llvm::WithColor::operator<<((WithColor *)(BaseIndent + 8),(StringRef *)&Offset);
    llvm::WithColor::~WithColor((WithColor *)(BaseIndent + 8));
  }
  pcVar20 = "";
  if (DumpOpts.ShowAddresses != false) {
    pcVar20 = " ";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_1d8,pcVar20,(allocator<char> *)(BaseIndent + 8));
  prVar25 = local_40;
  if (local_32[0] != DW_AT_abstract_origin) {
    if (local_32[0] == DW_AT_APPLE_property_attribute) {
      OVar28 = llvm::DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)local_d8);
      aStack_148 = OVar28.Storage.field_0;
      HighPC = CONCAT71(HighPC._1_7_,OVar28.Storage.hasVal);
      if (((undefined1  [16])OVar28.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        puVar19 = llvm::optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                            ((OptionalStorage<unsigned_long,_true> *)&aStack_148);
        uVar27 = *puVar19;
        llvm::raw_ostream::operator<<(prVar25," (");
        local_58 = &PTR_home_01127cf0;
        while( true ) {
          uVar18 = 0x40;
          if (uVar27 != 0) {
            lVar7 = 0;
            if (uVar27 != 0) {
              for (; (uVar27 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
              }
            }
            uVar18 = (uint)lVar7;
          }
          if (0x3f < uVar18) {
            __assert_fail("Shift < 64 && \"undefined behavior\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFDie.cpp"
                          ,0x2c,"void dumpApplePropertyAttribute(raw_ostream &, uint64_t)");
          }
          uVar26 = 1L << ((byte)uVar18 & 0x3f);
          Str = llvm::dwarf::ApplePropertyString((uint)uVar26);
          if (Str.Length == 0) {
            Val.Storage.field_0 =
                 (anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2)
                 "DW_APPLE_PROPERTY_0x%lx";
            stack0xfffffffffffffc08 = (uchar *)local_58;
            Val.Storage._8_8_ = uVar26;
            llvm::raw_ostream::operator<<(local_40,(format_object_base *)(BaseIndent + 8));
          }
          else {
            llvm::raw_ostream::operator<<(local_40,Str);
          }
          prVar25 = local_40;
          if (uVar27 == uVar26) break;
          uVar27 = uVar27 ^ uVar26;
          llvm::raw_ostream::operator<<(local_40,", ");
        }
        llvm::raw_ostream::operator<<(local_40,")");
      }
      goto LAB_00d96937;
    }
    if (local_32[0] == DW_AT_type) {
      prVar22 = llvm::raw_ostream::operator<<(local_40,(string *)auStack_1d8);
      llvm::raw_ostream::operator<<(prVar22,"\"");
      join_0x00000010_0x00000000_ =
           (ArrayRef<unsigned_char>)
           llvm::DWARFDie::getAttributeValueAsReferencedDie(Die,(DWARFFormValue *)local_d8);
      dumpTypeName(prVar25,(DWARFDie *)(BaseIndent + 8));
      llvm::raw_ostream::operator<<(prVar25,'\"');
      goto LAB_00d96937;
    }
    if (local_32[0] == DW_AT_ranges) {
      local_70._8_8_ =
           (Die->U->Context->DObj)._M_t.
           super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
           .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
      if (local_d8._0_2_ == DW_FORM_rnglistx) {
        OVar28 = llvm::DWARFFormValue::getAsSectionOffset((DWARFFormValue *)local_d8);
        stack0xfffffffffffffc08 = OVar28.Storage._0_9_;
        puVar19 = llvm::optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                            ((OptionalStorage<unsigned_long,_true> *)(BaseIndent + 8));
        OVar28 = llvm::DWARFUnit::getRnglistOffset(pDStack_48,(uint32_t)*puVar19);
        aStack_148 = OVar28.Storage.field_0;
        HighPC = CONCAT71(HighPC._1_7_,OVar28.Storage.hasVal);
        if (((undefined1  [16])OVar28.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          puVar19 = llvm::optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                              ((OptionalStorage<unsigned_long,_true> *)&aStack_148);
          llvm::DWARFFormValue::createFromUValue(DW_FORM_sec_offset,*puVar19);
          llvm::DWARFFormValue::dump((DWARFFormValue *)(BaseIndent + 8),prVar25,DumpOpts);
        }
      }
      llvm::DWARFDie::getAddressRanges
                ((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
                  *)(BaseIndent + 8),Die);
      if (((ulong)local_3e0 & 1) == 0) {
        psVar23 = llvm::
                  Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
                  ::getStorage((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
                                *)(BaseIndent + 8));
        prVar25 = local_40;
        if (DumpOpts.ShowAddresses != false) {
          bVar1 = (pDStack_48->Header).FormParams.AddrSize;
          if (local_33 != '\0') {
            (**(code **)(*(long *)local_70._8_8_ + 0x20))();
          }
          prVar22 = local_40;
          local_58 = (undefined **)(ulong)((int)local_58 + 0x11);
          pDVar4 = (psVar23->
                   super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          for (this_00 = (psVar23->
                         super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>
                         )._M_impl.super__Vector_impl_data._M_start; prVar25 = local_40,
              this_00 != pDVar4; this_00 = this_00 + 1) {
            llvm::raw_ostream::operator<<(prVar22,'\n');
            llvm::raw_ostream::indent(prVar22,(uint)local_58);
            aStack_148.value = 0xffffffffffffffff;
            HighPC = 0x1040000ffffffff;
            uStack_134 = 0;
            uStack_133 = 0;
            local_138 = 0;
            lVar7 = (ulong)CONCAT11(uStack_131,uStack_132) << 0x30;
            DumpOpts_00.ParentRecurseDepth = 0xffffffff;
            DumpOpts_00.Version = 0;
            DumpOpts_00.AddrSize = '\x04';
            DumpOpts_00.ShowAddresses = true;
            DumpOpts_00.DumpType = 0xffffffff;
            DumpOpts_00.ChildRecurseDepth = 0xffffffff;
            DumpOpts_00.ShowChildren = (bool)(char)lVar7;
            DumpOpts_00.ShowParents = (bool)(char)((ulong)lVar7 >> 8);
            DumpOpts_00.ShowForm = (bool)(char)((ulong)lVar7 >> 0x10);
            DumpOpts_00.SummarizeTypes = (bool)(char)((ulong)lVar7 >> 0x18);
            DumpOpts_00.Verbose = (bool)(char)((ulong)lVar7 >> 0x20);
            DumpOpts_00.DisplayRawContents = (bool)(char)((ulong)lVar7 >> 0x28);
            DumpOpts_00._22_2_ = (short)((ulong)lVar7 >> 0x30);
            llvm::DWARFAddressRange::dump(this_00,prVar22,(uint)bVar1,DumpOpts_00);
            llvm::DWARFFormValue::dumpAddressSection
                      ((DWARFObject *)local_70._8_8_,prVar22,DumpOpts,this_00->SectionIndex);
          }
        }
      }
      else {
        prVar22 = llvm::WithColor::error();
        prVar22 = llvm::raw_ostream::operator<<(prVar22,"decoding address ranges: ");
        llvm::
        Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>::
        takeError((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
                   *)&local_88.TStorage);
        llvm::toString_abi_cxx11_((string *)&aStack_148,(llvm *)&local_88.TStorage,E);
        prVar22 = llvm::raw_ostream::operator<<(prVar22,(string *)&aStack_148);
        llvm::raw_ostream::operator<<(prVar22,'\n');
        std::__cxx11::string::~string((string *)&aStack_148.empty);
        if ((long *)((ulong)local_88.ErrorStorage.buffer & 0xfffffffffffffffe) != (long *)0x0) {
          (**(code **)(*(long *)((ulong)local_88.ErrorStorage.buffer & 0xfffffffffffffffe) + 8))();
        }
      }
      llvm::
      Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>::
      ~Expected((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
                 *)(BaseIndent + 8));
      goto LAB_00d96937;
    }
    if (local_32[0] != DW_AT_specification) goto LAB_00d96937;
  }
  join_0x00000010_0x00000000_ =
       (ArrayRef<unsigned_char>)
       llvm::DWARFDie::getAttributeValueAsReferencedDie(Die,(DWARFFormValue *)local_d8);
  pcVar20 = llvm::DWARFDie::getName((DWARFDie *)(BaseIndent + 8),LinkageName);
  if (pcVar20 != (char *)0x0) {
    prVar22 = llvm::raw_ostream::operator<<(prVar25,(string *)auStack_1d8);
    prVar22 = llvm::raw_ostream::operator<<(prVar22,"\"");
    prVar22 = llvm::raw_ostream::operator<<(prVar22,pcVar20);
    llvm::raw_ostream::operator<<(prVar22,'\"');
  }
LAB_00d96937:
  llvm::raw_ostream::operator<<(prVar25,")\n");
  std::__cxx11::string::~string((string *)auStack_1d8);
  std::__cxx11::string::~string((string *)auStack_208);
  return;
}

Assistant:

static void dumpAttribute(raw_ostream &OS, const DWARFDie &Die,
                          uint64_t *OffsetPtr, dwarf::Attribute Attr,
                          dwarf::Form Form, unsigned Indent,
                          DIDumpOptions DumpOpts) {
  if (!Die.isValid())
    return;
  const char BaseIndent[] = "            ";
  OS << BaseIndent;
  OS.indent(Indent + 2);
  WithColor(OS, HighlightColor::Attribute) << formatv("{0}", Attr);

  if (DumpOpts.Verbose || DumpOpts.ShowForm)
    OS << formatv(" [{0}]", Form);

  DWARFUnit *U = Die.getDwarfUnit();
  DWARFFormValue FormValue = DWARFFormValue::createFromUnit(Form, U, OffsetPtr);

  OS << "\t(";

  StringRef Name;
  std::string File;
  auto Color = HighlightColor::Enumerator;
  if (Attr == DW_AT_decl_file || Attr == DW_AT_call_file) {
    Color = HighlightColor::String;
    if (const auto *LT = U->getContext().getLineTableForUnit(U))
      if (LT->getFileNameByIndex(
              FormValue.getAsUnsignedConstant().getValue(),
              U->getCompilationDir(),
              DILineInfoSpecifier::FileLineInfoKind::AbsoluteFilePath, File)) {
        File = '"' + File + '"';
        Name = File;
      }
  } else if (Optional<uint64_t> Val = FormValue.getAsUnsignedConstant())
    Name = AttributeValueString(Attr, *Val);

  if (!Name.empty())
    WithColor(OS, Color) << Name;
  else if (Attr == DW_AT_decl_line || Attr == DW_AT_call_line)
    OS << *FormValue.getAsUnsignedConstant();
  else if (Attr == DW_AT_high_pc && !DumpOpts.ShowForm && !DumpOpts.Verbose &&
           FormValue.getAsUnsignedConstant()) {
    if (DumpOpts.ShowAddresses) {
      // Print the actual address rather than the offset.
      uint64_t LowPC, HighPC, Index;
      if (Die.getLowAndHighPC(LowPC, HighPC, Index))
        OS << format("0x%016" PRIx64, HighPC);
      else
        FormValue.dump(OS, DumpOpts);
    }
  } else if (DWARFAttribute::mayHaveLocationDescription(Attr))
    dumpLocation(OS, FormValue, U, sizeof(BaseIndent) + Indent + 4, DumpOpts);
  else
    FormValue.dump(OS, DumpOpts);

  std::string Space = DumpOpts.ShowAddresses ? " " : "";

  // We have dumped the attribute raw value. For some attributes
  // having both the raw value and the pretty-printed value is
  // interesting. These attributes are handled below.
  if (Attr == DW_AT_specification || Attr == DW_AT_abstract_origin) {
    if (const char *Name =
            Die.getAttributeValueAsReferencedDie(FormValue).getName(
                DINameKind::LinkageName))
      OS << Space << "\"" << Name << '\"';
  } else if (Attr == DW_AT_type) {
    OS << Space << "\"";
    dumpTypeName(OS, Die.getAttributeValueAsReferencedDie(FormValue));
    OS << '"';
  } else if (Attr == DW_AT_APPLE_property_attribute) {
    if (Optional<uint64_t> OptVal = FormValue.getAsUnsignedConstant())
      dumpApplePropertyAttribute(OS, *OptVal);
  } else if (Attr == DW_AT_ranges) {
    const DWARFObject &Obj = Die.getDwarfUnit()->getContext().getDWARFObj();
    // For DW_FORM_rnglistx we need to dump the offset separately, since
    // we have only dumped the index so far.
    if (FormValue.getForm() == DW_FORM_rnglistx)
      if (auto RangeListOffset =
              U->getRnglistOffset(*FormValue.getAsSectionOffset())) {
        DWARFFormValue FV = DWARFFormValue::createFromUValue(
            dwarf::DW_FORM_sec_offset, *RangeListOffset);
        FV.dump(OS, DumpOpts);
      }
    if (auto RangesOrError = Die.getAddressRanges())
      dumpRanges(Obj, OS, RangesOrError.get(), U->getAddressByteSize(),
                 sizeof(BaseIndent) + Indent + 4, DumpOpts);
    else
      WithColor::error() << "decoding address ranges: "
                         << toString(RangesOrError.takeError()) << '\n';
  }

  OS << ")\n";
}